

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

CZString * __thiscall Json::Value::CZString::operator=(CZString *this,CZString *other)

{
  CZString *other_local;
  CZString *this_local;
  
  swap(this,other);
  return this;
}

Assistant:

Value::CZString& Value::CZString::operator=(CZString other) {
  swap(other);
  return *this;
}